

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

void nsvg__parseTransform(float *xform,char *str)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float args [1];
  int local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  float local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  
  xform[0] = 1.0;
  xform[1] = 0.0;
  xform[2] = 0.0;
  xform[3] = 1.0;
  xform[4] = 0.0;
  xform[5] = 0.0;
  if (*str != '\0') {
    do {
      iVar2 = strncmp(str,"matrix",6);
      if (iVar2 == 0) {
        local_9c = 0;
        iVar2 = nsvg__parseTransformArgs(str,&local_78,6,&local_9c);
        if (local_9c == 6) {
          fStack_88 = (float)local_68;
          fStack_84 = (float)((ulong)local_68 >> 0x20);
          local_98 = local_78;
          fStack_94 = fStack_74;
          fStack_90 = fStack_70;
          fStack_8c = fStack_6c;
        }
LAB_00115b5c:
        str = str + iVar2;
        nsvg__xformPremultiply(xform,&local_98);
      }
      else {
        iVar2 = strncmp(str,"translate",9);
        if (iVar2 == 0) {
          local_9c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_78,2,&local_9c);
          fStack_84 = 0.0;
          if (local_9c != 1) {
            fStack_84 = fStack_74;
          }
          local_98 = 1.0;
          fStack_94 = 0.0;
          fStack_90 = 0.0;
          fStack_8c = 1.0;
          fStack_88 = local_78;
          goto LAB_00115b5c;
        }
        iVar2 = strncmp(str,"scale",5);
        if (iVar2 == 0) {
          local_9c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_78,2,&local_9c);
          fStack_8c = local_78;
          if (local_9c != 1) {
            fStack_8c = fStack_74;
          }
          local_98 = local_78;
          fStack_94 = 0.0;
          fStack_90 = 0.0;
          fStack_88 = 0.0;
          fStack_84 = 0.0;
          goto LAB_00115b5c;
        }
        iVar2 = strncmp(str,"rotate",6);
        if (iVar2 == 0) {
          local_9c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_78,3,&local_9c);
          if (local_9c == 1) {
            fStack_74 = 0.0;
            fStack_70 = 0.0;
LAB_001159db:
            local_58 = 0;
            bVar1 = false;
          }
          else {
            if (local_9c < 2) goto LAB_001159db;
            local_58 = CONCAT44(0.0 - fStack_70,0.0 - fStack_74);
            bVar1 = true;
          }
          uStack_50 = 0;
          local_5c = (local_78 / 180.0) * 3.1415927;
          local_48 = cosf(local_5c);
          fVar3 = sinf(local_5c);
          fVar4 = local_48 - fVar3 * 0.0;
          fStack_94 = fVar3 + local_48 * 0.0;
          fVar5 = local_48 * 0.0 - fVar3;
          fStack_8c = fVar3 * 0.0 + local_48;
          fStack_88 = local_48 * (float)local_58 + -fVar3 * local_58._4_4_ + 0.0;
          fStack_84 = fVar3 * (float)local_58 + local_48 * local_58._4_4_ + 0.0;
          local_98 = fVar4;
          fStack_90 = fVar5;
          if (bVar1) {
            local_98 = fStack_94 * 0.0 + fVar4;
            fStack_90 = fStack_8c * 0.0 + fVar5;
            fStack_94 = fStack_94 + fVar4 * 0.0;
            fStack_8c = fStack_8c + fVar5 * 0.0;
            fVar3 = fStack_88 * 0.0;
            fStack_88 = fStack_84 * 0.0 + fStack_88 + fStack_74;
            fStack_84 = fVar3 + fStack_84 + fStack_70;
          }
          goto LAB_00115b5c;
        }
        iVar2 = strncmp(str,"skewX",5);
        if (iVar2 == 0) {
          local_9c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_78,1,&local_9c);
          fStack_90 = tanf((local_78 / 180.0) * 3.1415927);
          local_98 = 1.0;
          fStack_94 = 0.0;
          fStack_8c = 1.0;
          fStack_88 = 0.0;
          fStack_84 = 0.0;
          goto LAB_00115b5c;
        }
        iVar2 = strncmp(str,"skewY",5);
        if (iVar2 == 0) {
          local_9c = 0;
          iVar2 = nsvg__parseTransformArgs(str,&local_78,1,&local_9c);
          fStack_94 = tanf((local_78 / 180.0) * 3.1415927);
          local_98 = 1.0;
          fStack_90 = 0.0;
          fStack_8c = 1.0;
          fStack_88 = 0.0;
          fStack_84 = 0.0;
          goto LAB_00115b5c;
        }
        str = str + 1;
      }
    } while (*str != '\0');
  }
  return;
}

Assistant:

static void nsvg__xformIdentity(float* t)
{
	t[0] = 1.0f; t[1] = 0.0f;
	t[2] = 0.0f; t[3] = 1.0f;
	t[4] = 0.0f; t[5] = 0.0f;
}